

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

uint32 get32(stbi *s)

{
  int iVar1;
  int iVar2;
  
  iVar1 = get16(s);
  iVar2 = get16(s);
  return iVar2 + iVar1 * 0x10000;
}

Assistant:

static uint32 get32(stbi *s)
{
   uint32 z = get16(s);
   return (z << 16) + get16(s);
}